

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::fragment_index::key(fragment_index *this,string *s)

{
  undefined8 uVar1;
  bool bVar2;
  uint128 *puVar3;
  error_code eVar4;
  undefined1 local_48 [8];
  maybe<pstore::uint128,_void> digest;
  string *s_local;
  fragment_index *this_local;
  error_category *local_10;
  
  digest.storage_._8_8_ = s;
  uint128::from_hex_string((maybe<pstore::uint128,_void> *)local_48,s);
  bVar2 = pstore::maybe::operator_cast_to_bool((maybe *)local_48);
  if (bVar2) {
    puVar3 = maybe<pstore::uint128,_void>::operator*((maybe<pstore::uint128,_void> *)local_48);
    uVar1 = *(undefined8 *)((long)&puVar3->v_ + 8);
    *(long *)&(this->digest_).v_ = (long)puVar3->v_;
    *(undefined8 *)((long)&(this->digest_).v_ + 8) = uVar1;
    eVar4 = push_object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>
                      (&this->super_rule,(this->transaction_).ptr_,(this->names_).ptr_,
                       &this->digest_);
    local_10 = eVar4._M_cat;
    this_local._0_4_ = eVar4._M_value;
  }
  maybe<pstore::uint128,_void>::~maybe((maybe<pstore::uint128,_void> *)local_48);
  if (!bVar2) {
    std::error_code::error_code<pstore::exchange::import_ns::error,void>
              ((error_code *)&this_local,bad_digest);
  }
  eVar4._4_4_ = 0;
  eVar4._M_value = (uint)this_local;
  eVar4._M_cat = local_10;
  return eVar4;
}

Assistant:

std::error_code fragment_index::key (std::string const & s) {
                if (maybe<index::digest> const digest = uint128::from_hex_string (s)) {
                    digest_ = *digest;
                    return push_object_rule<fragment_sections> (this, transaction_, names_,
                                                                &digest_);
                }
                return error::bad_digest;
            }